

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitSuperCall
          (ByteCodeGenerator *this,FuncInfo *funcInfo,ParseNodeSuperCall *pnodeSuperCall,
          BOOL fReturnValue,BOOL fEvaluateComponents)

{
  byte bVar1;
  Symbol *sym;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  RegSlot R0;
  RegSlot R0_00;
  RegSlot R0_01;
  ByteCodeLabel BVar5;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  ByteCodeLabel labelID_01;
  RegSlot R1;
  ByteCodeWriter *pBVar6;
  undefined4 *puVar7;
  Symbol *thisSym;
  ByteCodeLabel skipLabel;
  RegSlot tmpReg;
  ByteCodeLabel doneLabel;
  ByteCodeLabel useSuperCallResultLabel;
  ByteCodeLabel makeCallLabel;
  ByteCodeLabel useNewTargetForThisLabel;
  RegSlot tmpUndeclReg;
  RegSlot valueForThis;
  RegSlot thisForSuperCall;
  bool isResultUsed;
  FuncInfo *nonLambdaFunc;
  BOOL fEvaluateComponents_local;
  BOOL fReturnValue_local;
  ParseNodeSuperCall *pnodeSuperCall_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  bVar1 = (pnodeSuperCall->super_ParseNodeCall).super_ParseNode.field_0x1;
  BVar4 = FuncInfo::IsLambda(funcInfo);
  _thisForSuperCall = funcInfo;
  if (BVar4 != 0) {
    _thisForSuperCall = FindEnclosingNonLambda(this);
  }
  BVar4 = FuncInfo::IsBaseClassConstructor(_thisForSuperCall);
  if (BVar4 == 0) {
    (pnodeSuperCall->super_ParseNodeCall).super_ParseNode.field_0x1 =
         (pnodeSuperCall->super_ParseNodeCall).super_ParseNode.field_0x1 & 0xfe | 1;
    FuncInfo::AcquireLoc(funcInfo,(ParseNode *)pnodeSuperCall);
    FuncInfo::AcquireLoc(funcInfo,(ParseNode *)pnodeSuperCall->pnodeThis);
    EmitPropLoadThis(this,(pnodeSuperCall->pnodeThis->super_ParseNodeName).super_ParseNode.location,
                     pnodeSuperCall->pnodeThis,funcInfo,false);
    EmitLoad((ParseNode *)pnodeSuperCall->pnodeNewTarget,this,funcInfo);
    if (((byte)(pnodeSuperCall->super_ParseNodeCall).field_0x24 >> 3 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x8ff,"(pnodeSuperCall->isSuperCall)","pnodeSuperCall->isSuperCall");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    EmitLoad((pnodeSuperCall->super_ParseNodeCall).pnodeTarget,this,funcInfo);
    R0 = FuncInfo::AcquireTmpRegister(funcInfo);
    R0_00 = FuncInfo::AcquireTmpRegister(funcInfo);
    R0_01 = FuncInfo::AcquireTmpRegister(funcInfo);
    pBVar6 = Writer(this);
    BVar5 = Js::ByteCodeWriter::DefineLabel(pBVar6);
    pBVar6 = Writer(this);
    labelID = Js::ByteCodeWriter::DefineLabel(pBVar6);
    pBVar6 = Writer(this);
    labelID_00 = Js::ByteCodeWriter::DefineLabel(pBVar6);
    pBVar6 = Writer(this);
    labelID_01 = Js::ByteCodeWriter::DefineLabel(pBVar6);
    R1 = EmitLdObjProto(this,LdFuncObjProto,
                        ((pnodeSuperCall->super_ParseNodeCall).pnodeTarget)->location,funcInfo);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::BrReg1(pBVar6,BrOnClassConstructor,BVar5,R1);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::Reg2
              (pBVar6,NewScObjectNoCtorFull,R0,
               (pnodeSuperCall->pnodeNewTarget->super_ParseNodeName).super_ParseNode.location);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::Br(pBVar6,Br,labelID);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::MarkLabel(pBVar6,BVar5);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::Reg2
              (pBVar6,Ld_A_ReuseLoc,R0,
               (pnodeSuperCall->pnodeNewTarget->super_ParseNodeName).super_ParseNode.location);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::MarkLabel(pBVar6,labelID);
    EmitCall(&pnodeSuperCall->super_ParseNodeCall,this,funcInfo,fReturnValue,fEvaluateComponents,R0,
             (pnodeSuperCall->pnodeNewTarget->super_ParseNodeName).super_ParseNode.location);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::BrReg1
              (pBVar6,BrOnObject_A,labelID_00,
               (pnodeSuperCall->super_ParseNodeCall).super_ParseNode.location);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::Reg2(pBVar6,Ld_A,R0_00,R0);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::Br(pBVar6,Br,labelID_01);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::MarkLabel(pBVar6,labelID_00);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::Reg2
              (pBVar6,Ld_A_ReuseLoc,R0_00,
               (pnodeSuperCall->super_ParseNodeCall).super_ParseNode.location);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::MarkLabel(pBVar6,labelID_01);
    pBVar6 = Writer(this);
    BVar5 = Js::ByteCodeWriter::DefineLabel(pBVar6);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::Reg1(pBVar6,InitUndecl,R0_01);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::BrReg2
              (pBVar6,BrSrEq_A,BVar5,
               (pnodeSuperCall->pnodeThis->super_ParseNodeName).super_ParseNode.location,R0_01);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::W1(pBVar6,RuntimeReferenceError,0x15fc);
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::MarkLabel(pBVar6,BVar5);
    if ((bVar1 & 1) != 0) {
      pBVar6 = Writer(this);
      Js::ByteCodeWriter::Reg2
                (pBVar6,Ld_A,(pnodeSuperCall->super_ParseNodeCall).super_ParseNode.location,R0_00);
    }
    sym = (pnodeSuperCall->pnodeThis->super_ParseNodeName).sym;
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::Reg2
              (pBVar6,Ld_A,(pnodeSuperCall->pnodeThis->super_ParseNodeName).super_ParseNode.location
               ,R0_00);
    EmitPropStoreForSpecialSymbol
              (this,(pnodeSuperCall->pnodeThis->super_ParseNodeName).super_ParseNode.location,sym,
               (pnodeSuperCall->pnodeThis->super_ParseNodeName).pid,funcInfo,false);
    FuncInfo::ReleaseTmpRegister(funcInfo,R0_01);
    FuncInfo::ReleaseTmpRegister(funcInfo,R0_00);
    FuncInfo::ReleaseTmpRegister(funcInfo,R0);
    FuncInfo::ReleaseLoc(funcInfo,(pnodeSuperCall->super_ParseNodeCall).pnodeTarget);
    FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pnodeSuperCall->pnodeNewTarget);
    FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pnodeSuperCall->pnodeThis);
  }
  else {
    pBVar6 = Writer(this);
    Js::ByteCodeWriter::W1(pBVar6,RuntimeReferenceError,0x15fd);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitSuperCall(FuncInfo* funcInfo, ParseNodeSuperCall * pnodeSuperCall, BOOL fReturnValue, BOOL fEvaluateComponents)
{
    FuncInfo* nonLambdaFunc = funcInfo;
    bool isResultUsed = pnodeSuperCall->isUsed;

    if (funcInfo->IsLambda())
    {
        nonLambdaFunc = this->FindEnclosingNonLambda();
    }

    if (nonLambdaFunc->IsBaseClassConstructor())
    {
        // super() is not allowed in base class constructors. If we detect this, emit a ReferenceError and skip making the call.
        this->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_ClassSuperInBaseClass));
        return;
    }

    pnodeSuperCall->isUsed = true;

    // pnode->location refers to two things: the result of the inner function call (`temp` in the pseudocode below),
    // and the result of the super() expression itself
    funcInfo->AcquireLoc(pnodeSuperCall);

    // We need to emit 'this' directly so we can skip throwing a reference error if 'this' is currently undecl (we want to get undecl if 'this' is undecl)
    funcInfo->AcquireLoc(pnodeSuperCall->pnodeThis);
    EmitPropLoadThis(pnodeSuperCall->pnodeThis->location, pnodeSuperCall->pnodeThis, funcInfo, false);

    EmitLoad(pnodeSuperCall->pnodeNewTarget, this, funcInfo);

    Assert(pnodeSuperCall->isSuperCall);
    EmitLoad(pnodeSuperCall->pnodeTarget, this, funcInfo);

    //
    // if (super is class constructor) {
    //   _this = new.target;
    // } else {
    //   _this = NewScObjFull(new.target);
    // }
    //
    // temp = super.call(_this, new.target); // CallFlag_New | CallFlag_NewTarget | CallFlag_ExtraArg
    // if (temp is object) {
    //   _this = temp;
    // }
    //
    // if (UndeclBlockVar === this) {
    //   this = _this;
    // } else {
    //   throw ReferenceError;
    // }
    //
    Js::RegSlot thisForSuperCall = funcInfo->AcquireTmpRegister();
    Js::RegSlot valueForThis = funcInfo->AcquireTmpRegister();
    Js::RegSlot tmpUndeclReg = funcInfo->AcquireTmpRegister();

    Js::ByteCodeLabel useNewTargetForThisLabel = this->Writer()->DefineLabel();
    Js::ByteCodeLabel makeCallLabel = this->Writer()->DefineLabel();
    Js::ByteCodeLabel useSuperCallResultLabel = this->Writer()->DefineLabel();
    Js::ByteCodeLabel doneLabel = this->Writer()->DefineLabel();

    Js::RegSlot tmpReg = this->EmitLdObjProto(Js::OpCode::LdFuncObjProto, pnodeSuperCall->pnodeTarget->location, funcInfo);
    this->Writer()->BrReg1(Js::OpCode::BrOnClassConstructor, useNewTargetForThisLabel, tmpReg);
    this->Writer()->Reg2(Js::OpCode::NewScObjectNoCtorFull, thisForSuperCall, pnodeSuperCall->pnodeNewTarget->location);
    this->Writer()->Br(Js::OpCode::Br, makeCallLabel);
    this->Writer()->MarkLabel(useNewTargetForThisLabel);
    this->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, thisForSuperCall, pnodeSuperCall->pnodeNewTarget->location);
    this->Writer()->MarkLabel(makeCallLabel);
    EmitCall(pnodeSuperCall, this, funcInfo, fReturnValue, fEvaluateComponents, thisForSuperCall, pnodeSuperCall->pnodeNewTarget->location);

    // We have to use another temp for the this value before assigning to this register.
    // This is because IRBuilder does not expect us to use the value of a temp after potentially assigning to that same temp.
    // Ex:
    // _this = new.target;
    // temp = super.call(_this);
    // if (temp is object) {
    //   _this = temp; // creates a new sym for _this as it was previously used
    // }
    // this = _this; // tries to loads a value from the old sym (which is dead)

    this->Writer()->BrReg1(Js::OpCode::BrOnObject_A, useSuperCallResultLabel, pnodeSuperCall->location);
    this->Writer()->Reg2(Js::OpCode::Ld_A, valueForThis, thisForSuperCall);
    this->Writer()->Br(Js::OpCode::Br, doneLabel);
    this->Writer()->MarkLabel(useSuperCallResultLabel);
    this->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, valueForThis, pnodeSuperCall->location);
    this->Writer()->MarkLabel(doneLabel);

    // The call is done and we know what we will bind to 'this' so let's check to see if 'this' is already decl.
    Js::ByteCodeLabel skipLabel = this->Writer()->DefineLabel();
    this->Writer()->Reg1(Js::OpCode::InitUndecl, tmpUndeclReg);
    this->Writer()->BrReg2(Js::OpCode::BrSrEq_A, skipLabel, pnodeSuperCall->pnodeThis->location, tmpUndeclReg);
    this->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_ClassThisAlreadyAssigned));
    this->Writer()->MarkLabel(skipLabel);

    // If calling code cares about the return value, then move the selected `this` value into the result register.
    if (isResultUsed)
    {
        this->Writer()->Reg2(Js::OpCode::Ld_A, pnodeSuperCall->location, valueForThis);
    }

    Symbol* thisSym = pnodeSuperCall->pnodeThis->sym;
    this->Writer()->Reg2(Js::OpCode::Ld_A, pnodeSuperCall->pnodeThis->location, valueForThis);

    EmitPropStoreForSpecialSymbol(pnodeSuperCall->pnodeThis->location, thisSym, pnodeSuperCall->pnodeThis->pid, funcInfo, false);

    funcInfo->ReleaseTmpRegister(tmpUndeclReg);
    funcInfo->ReleaseTmpRegister(valueForThis);
    funcInfo->ReleaseTmpRegister(thisForSuperCall);

    funcInfo->ReleaseLoc(pnodeSuperCall->pnodeTarget);
    funcInfo->ReleaseLoc(pnodeSuperCall->pnodeNewTarget);
    funcInfo->ReleaseLoc(pnodeSuperCall->pnodeThis);
}